

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_window.c
# Opt level: O0

GLFWbool createShellObjects(_GLFWwindow *window)

{
  GLFWbool GVar1;
  _GLFWwindow *window_local;
  
  if ((_glfw.wl.libdecor.context == (libdecor *)0x0) ||
     (GVar1 = createLibdecorFrame(window), GVar1 == 0)) {
    window_local._4_4_ = createXdgShellObjects(window);
  }
  else {
    window_local._4_4_ = 1;
  }
  return window_local._4_4_;
}

Assistant:

static GLFWbool createShellObjects(_GLFWwindow* window)
{
    if (_glfw.wl.libdecor.context)
    {
        if (createLibdecorFrame(window))
            return GLFW_TRUE;
    }

    return createXdgShellObjects(window);
}